

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# toggle.cpp
# Opt level: O0

Component ftxui::Toggle(ConstStringListRef entries,int *selected,Ref<ftxui::ToggleOption> *option)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  element_type *this;
  Component CVar1;
  ConstStringListRef local_40;
  Ref<ftxui::ToggleOption> *option_local;
  int *selected_local;
  ConstStringListRef entries_local;
  
  selected_local = (int *)entries.ref_wide_;
  this = (element_type *)entries.ref_;
  option_local = option;
  entries_local.ref_ =
       (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        *)selected;
  entries_local.ref_wide_ =
       (vector<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
        *)this;
  Make<ftxui::(anonymous_namespace)::ToggleBase,ftxui::ConstStringListRef&,int*&,ftxui::Ref<ftxui::ToggleOption>>
            (&local_40,&selected_local,(Ref<ftxui::ToggleOption> *)&option_local);
  std::shared_ptr<ftxui::ComponentBase>::shared_ptr<ftxui::(anonymous_namespace)::ToggleBase,void>
            ((shared_ptr<ftxui::ComponentBase> *)this,
             (shared_ptr<ftxui::(anonymous_namespace)::ToggleBase> *)&local_40);
  std::shared_ptr<ftxui::(anonymous_namespace)::ToggleBase>::~shared_ptr
            ((shared_ptr<ftxui::(anonymous_namespace)::ToggleBase> *)&local_40);
  CVar1.super___shared_ptr<ftxui::ComponentBase,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  CVar1.super___shared_ptr<ftxui::ComponentBase,_(__gnu_cxx::_Lock_policy)2>._M_ptr = this;
  return (Component)CVar1.super___shared_ptr<ftxui::ComponentBase,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

Component Toggle(ConstStringListRef entries,
                 int* selected,
                 Ref<ToggleOption> option) {
  return Make<ToggleBase>(entries, selected, std::move(option));
}